

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void run_proper_context_tests(int use_prealloc)

{
  uint uVar1;
  _func_void_char_ptr_void_ptr *p_Var2;
  int iVar3;
  secp256k1_context *b;
  secp256k1_context *psVar4;
  secp256k1_context *a;
  secp256k1_context *psVar5;
  secp256k1_context *unaff_R12;
  secp256k1_context *unaff_R13;
  code *num;
  int32_t dummy;
  secp256k1_ge pub;
  uchar seed [32];
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar msg;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_gej pubj;
  undefined4 local_1f8;
  int local_1f4;
  void **local_1f0;
  secp256k1_context *local_1e8;
  secp256k1_context *local_1e0;
  secp256k1_context *local_1d8;
  secp256k1_ge local_1d0;
  uchar local_178 [32];
  undefined1 local_158 [64];
  undefined1 local_118 [96];
  secp256k1_gej local_b8;
  
  num = (code *)(ulong)(uint)use_prealloc;
  local_1f8 = 0;
  local_178[0x10] = '\0';
  local_178[0x11] = '\0';
  local_178[0x12] = '\0';
  local_178[0x13] = '\0';
  local_178[0x14] = '\0';
  local_178[0x15] = '\0';
  local_178[0x16] = '\0';
  local_178[0x17] = '\0';
  local_178[0x18] = '\0';
  local_178[0x19] = '\0';
  local_178[0x1a] = '\0';
  local_178[0x1b] = '\0';
  local_178[0x1c] = '\0';
  local_178[0x1d] = '\0';
  local_178[0x1e] = '\0';
  local_178[0x1f] = '\0';
  local_178[0] = '\x17';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  local_178[8] = '\0';
  local_178[9] = '\0';
  local_178[10] = '\0';
  local_178[0xb] = '\0';
  local_178[0xc] = '\0';
  local_178[0xd] = '\0';
  local_178[0xe] = '\0';
  local_178[0xf] = '\0';
  b = secp256k1_context_create(1);
  if (use_prealloc == 0) {
    a = secp256k1_context_create(1);
    psVar4 = (secp256k1_context *)0x0;
  }
  else {
    local_b8.x.n[0] = 0x4d430002;
    local_b8.x.n[1] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_1d0.x.n[0] = 0;
    psVar4 = (secp256k1_context *)malloc(0xd0);
    if (psVar4 == (secp256k1_context *)0x0) goto LAB_0013d031;
    a = secp256k1_context_preallocated_create(psVar4,1);
  }
  iVar3 = context_eq(a,b);
  if (iVar3 == 0) {
    run_proper_context_tests_cold_30();
LAB_0013cf8e:
    run_proper_context_tests_cold_29();
LAB_0013cf96:
    run_proper_context_tests_cold_2();
LAB_0013cf9b:
    run_proper_context_tests_cold_28();
LAB_0013cfa3:
    run_proper_context_tests_cold_27();
LAB_0013cfa8:
    run_proper_context_tests_cold_3();
  }
  else {
    if ((a->ecmult_gen_ctx).built == 0) goto LAB_0013cf8e;
    secp256k1_ecmult_gen_blind(&a->ecmult_gen_ctx,local_178);
    iVar3 = context_eq(a,b);
    if (iVar3 != 0) goto LAB_0013cf96;
    if ((a->ecmult_gen_ctx).built == 0) goto LAB_0013cf9b;
    secp256k1_ecmult_gen_blind(&a->ecmult_gen_ctx,(uchar *)0x0);
    iVar3 = context_eq(a,b);
    if (iVar3 == 0) goto LAB_0013cfa3;
    if (secp256k1_context_static == a) goto LAB_0013cfa8;
    (a->error_callback).fn = secp256k1_default_illegal_callback_fn;
    (a->error_callback).data = (void *)0x0;
  }
  uVar1 = (a->ecmult_gen_ctx).built;
  unaff_R13 = (secp256k1_context *)(ulong)uVar1;
  if (uVar1 == 0) {
    run_proper_context_tests_cold_4();
  }
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  if (uVar1 == 0) {
    run_proper_context_tests_cold_26();
    goto LAB_0013cfc7;
  }
  if (use_prealloc != 0) {
    unaff_R12 = secp256k1_context_clone(a);
    iVar3 = context_eq(a,unaff_R12);
    unaff_R13 = psVar4;
    if (iVar3 == 0) goto LAB_0013d036;
    if ((a->ecmult_gen_ctx).built == 0) goto LAB_0013d03b;
    (a->ecmult_gen_ctx).built = 0;
    memset(&(a->ecmult_gen_ctx).blind,0,0x9c);
    do {
      free(unaff_R13);
      local_b8.x.n[0] = 0x4d430002;
      local_b8.x.n[1] = 0;
      local_b8.x.n[2] = 0;
      local_b8.x.n[3] = 0;
      local_b8.x.n[4] = 0;
      local_b8.y.n[0] = 0;
      local_1d0.x.n[0] = 0;
      a = (secp256k1_context *)malloc(0xd0);
      if (a == (secp256k1_context *)0x0) {
        run_proper_context_tests_cold_9();
LAB_0013d04d:
        run_proper_context_tests_cold_6();
        a = (secp256k1_context *)0x0;
      }
      else {
        unaff_R13 = a;
        if ((unaff_R12->ecmult_gen_ctx).built == 0) goto LAB_0013d04d;
        memcpy(a,unaff_R12,0xd0);
      }
      iVar3 = context_eq(unaff_R12,a);
      if (iVar3 == 0) {
        run_proper_context_tests_cold_8();
LAB_0013d062:
        run_proper_context_tests_cold_7();
      }
      else {
        if ((unaff_R12->ecmult_gen_ctx).built == 0) goto LAB_0013d062;
        free(unaff_R12);
      }
LAB_0013cd63:
      p_Var2 = (a->error_callback).fn;
      psVar4 = unaff_R13;
      if (p_Var2 == secp256k1_default_error_callback_fn) {
LAB_0013cfc7:
        run_proper_context_tests_cold_22();
LAB_0013cfcc:
        run_proper_context_tests_cold_14();
LAB_0013cfd1:
        run_proper_context_tests_cold_15();
        unaff_R13 = psVar4;
      }
      else {
        local_1f4 = (int)num;
        num = secp256k1_default_illegal_callback_fn;
        if (p_Var2 != secp256k1_default_illegal_callback_fn) goto LAB_0013cfcc;
        if (secp256k1_context_static == a) goto LAB_0013cfd1;
        (a->error_callback).fn = secp256k1_default_error_callback_fn;
        (a->error_callback).data = (void *)0x0;
      }
      iVar3 = context_eq(a,b);
      if (iVar3 == 0) {
        run_proper_context_tests_cold_21();
LAB_0013cfea:
        run_proper_context_tests_cold_16();
      }
      else {
        unaff_R12 = (secp256k1_context *)&a->illegal_callback;
        local_1f0 = &(a->illegal_callback).data;
        if (secp256k1_context_static == a) goto LAB_0013cfea;
        ((secp256k1_callback *)unaff_R12)->fn = counting_illegal_callback_fn;
        *local_1f0 = &local_1f8;
      }
      if (secp256k1_context_static == a) {
        run_proper_context_tests_cold_17();
      }
      else {
        *(code **)&unaff_R12->ecmult_gen_ctx = num;
        *local_1f0 = (void *)0x0;
      }
      iVar3 = context_eq(a,b);
      if (iVar3 == 0) {
        run_proper_context_tests_cold_20();
LAB_0013d027:
        run_proper_context_tests_cold_19();
      }
      else {
        local_1e8 = b;
        local_1e0 = unaff_R12;
        local_1d8 = unaff_R13;
        random_scalar_order_test((secp256k1_scalar *)local_118);
        num = (code *)(local_118 + 0x40);
        random_scalar_order_test((secp256k1_scalar *)num);
        secp256k1_ecmult_gen(&a->ecmult_gen_ctx,&local_b8,(secp256k1_scalar *)num);
        secp256k1_ge_set_gej(&local_1d0,&local_b8);
        unaff_R12 = (secp256k1_context *)(local_158 + 0x20);
        unaff_R13 = (secp256k1_context *)local_158;
        do {
          random_scalar_order_test((secp256k1_scalar *)(local_118 + 0x20));
          iVar3 = secp256k1_ecdsa_sig_sign
                            (&a->ecmult_gen_ctx,(secp256k1_scalar *)unaff_R12,
                             (secp256k1_scalar *)unaff_R13,(secp256k1_scalar *)num,
                             (secp256k1_scalar *)local_118,(secp256k1_scalar *)(local_118 + 0x20),
                             (int *)0x0);
        } while (iVar3 == 0);
        iVar3 = secp256k1_ecdsa_sig_sign
                          (&a->ecmult_gen_ctx,(secp256k1_scalar *)(local_158 + 0x20),
                           (secp256k1_scalar *)local_158,(secp256k1_scalar *)(local_118 + 0x40),
                           (secp256k1_scalar *)local_118,(secp256k1_scalar *)(local_118 + 0x20),
                           (int *)0x0);
        b = (secp256k1_context *)local_118;
        if (iVar3 == 0) goto LAB_0013d027;
        iVar3 = secp256k1_ecdsa_sig_verify
                          ((secp256k1_scalar *)(local_158 + 0x20),(secp256k1_scalar *)local_158,
                           &local_1d0,(secp256k1_scalar *)local_118);
        psVar5 = local_1d8;
        psVar4 = local_1e8;
        if (iVar3 != 0) {
          if (local_1f4 == 0) {
            secp256k1_context_destroy(a);
            psVar4 = local_1e8;
          }
          else {
            if (a != (secp256k1_context *)0x0) {
              if ((a->ecmult_gen_ctx).built == 0) {
                (**(code **)&local_1e0->ecmult_gen_ctx)
                          ("ctx == NULL || secp256k1_context_is_proper(ctx)",*local_1f0);
              }
              else {
                (a->ecmult_gen_ctx).built = 0;
                memset(&(a->ecmult_gen_ctx).blind,0,0x9c);
              }
            }
            free(psVar5);
          }
          secp256k1_context_destroy(psVar4);
          return;
        }
      }
      run_proper_context_tests_cold_18();
LAB_0013d031:
      run_proper_context_tests_cold_1();
LAB_0013d036:
      run_proper_context_tests_cold_10();
LAB_0013d03b:
      run_proper_context_tests_cold_5();
    } while( true );
  }
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  psVar5 = (secp256k1_context *)malloc(0xd0);
  if (psVar5 == (secp256k1_context *)0x0) {
    run_proper_context_tests_cold_25();
LAB_0013d08f:
    run_proper_context_tests_cold_11();
    psVar5 = (secp256k1_context *)0x0;
  }
  else {
    unaff_R13 = psVar4;
    unaff_R12 = psVar5;
    if ((a->ecmult_gen_ctx).built == 0) goto LAB_0013d08f;
    memcpy(psVar5,a,0xd0);
  }
  iVar3 = context_eq(a,psVar5);
  if (iVar3 == 0) {
    run_proper_context_tests_cold_24();
LAB_0013d0a4:
    run_proper_context_tests_cold_12();
  }
  else {
    if ((a->ecmult_gen_ctx).built == 0) goto LAB_0013d0a4;
    free(a);
  }
  a = secp256k1_context_clone(psVar5);
  iVar3 = context_eq(psVar5,a);
  if (iVar3 == 0) {
    run_proper_context_tests_cold_23();
  }
  else {
    if (psVar5 == (secp256k1_context *)0x0) goto LAB_0013cd58;
    if ((psVar5->ecmult_gen_ctx).built != 0) {
      (psVar5->ecmult_gen_ctx).built = 0;
      memset(&(psVar5->ecmult_gen_ctx).blind,0,0x9c);
      goto LAB_0013cd58;
    }
  }
  run_proper_context_tests_cold_13();
LAB_0013cd58:
  free(unaff_R12);
  goto LAB_0013cd63;
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_illegal_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    random_scalar_order_test(&msg);
    random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}